

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intmem.h
# Opt level: O0

short intmem::loadu_le<short>(uint8_t *Ptr)

{
  short sVar1;
  uint8_t *Ptr_local;
  
  sVar1 = loadu<short>(Ptr);
  sVar1 = bswap_le<short>(sVar1);
  return sVar1;
}

Assistant:

static INTMEM_CE T loadu_le(const uint8_t* Ptr)
{
#ifdef INTMEM_CPP20_SUPPORT
  if (std::is_constant_evaluated()) {
    T Ret = 0;
    for (size_t I = 0; I < sizeof(T); ++I) {
      Ret |= ((T)(Ptr[I])) << (I*8);
    }
    return Ret;
  }
#endif
  return bswap_le(loadu<T>(Ptr));
}